

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaper.cpp
# Opt level: O0

void __thiscall zmq::reaper_t::process_stop(reaper_t *this)

{
  long in_RDI;
  handle_t in_stack_00000008;
  object_t *in_stack_00000048;
  
  *(undefined1 *)(in_RDI + 0xe4) = 1;
  if (*(int *)(in_RDI + 0xe0) == 0) {
    object_t::send_done(in_stack_00000048);
    epoll_t::rm_fd((epoll_t *)this,in_stack_00000008);
    epoll_t::stop((epoll_t *)0x2cb2b6);
  }
  return;
}

Assistant:

void zmq::reaper_t::process_stop ()
{
    _terminating = true;

    //  If there are no sockets being reaped finish immediately.
    if (!_sockets) {
        send_done ();
        _poller->rm_fd (_mailbox_handle);
        _poller->stop ();
    }
}